

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void * lys_set_private(lys_node *node,void *priv)

{
  LY_ERR *pLVar1;
  void *pvVar2;
  
  if (node == (lys_node *)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EINVAL;
    pvVar2 = (void *)0x0;
    ly_log(LY_LLERR,"%s: Invalid parameter.","lys_set_private");
  }
  else {
    pvVar2 = node->priv;
    node->priv = priv;
  }
  return pvVar2;
}

Assistant:

API void *
lys_set_private(const struct lys_node *node, void *priv)
{
    void *prev;

    if (!node) {
        LOGERR(LY_EINVAL, "%s: Invalid parameter.", __func__);
        return NULL;
    }

    prev = node->priv;
    ((struct lys_node *)node)->priv = priv;

    return prev;
}